

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sniff_csv.cpp
# Opt level: O0

string * duckdb::FormatOptions(string *opt)

{
  long lVar1;
  string *in_RSI;
  string *in_RDI;
  char in_stack_0000000f;
  
  lVar1 = ::std::__cxx11::string::size();
  if (lVar1 == 1) {
    ::std::__cxx11::string::operator[]((ulong)in_RSI);
    FormatOptions_abi_cxx11_(in_stack_0000000f);
  }
  else {
    ::std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  return in_RDI;
}

Assistant:

string FormatOptions(string opt) {
	if (opt.size() == 1) {
		return FormatOptions(opt[0]);
	}
	return opt;
}